

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QSize>::emplace<QSize>
          (QMovableArrayOps<QSize> *this,qsizetype i,QSize *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  QSize *pQVar4;
  Inserter *in_RDX;
  QSize *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QSize tmp;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar7;
  Inserter *this_00;
  Inserter local_38;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QSize>::needsDetach((QArrayDataPointer<QSize> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QSize>::freeSpaceAtEnd
                          ((QArrayDataPointer<QSize> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QSize>::end((QArrayDataPointer<QSize> *)in_RDI);
      *pQVar4 = (QSize)in_RDX->data;
      in_RDI->displaceTo = (QSize *)((long)&(in_RDI->displaceTo->wd).m_i + 1);
      goto LAB_00109598;
    }
    if ((in_RSI == (QSize *)0x0) &&
       (qVar3 = QArrayDataPointer<QSize>::freeSpaceAtBegin
                          ((QArrayDataPointer<QSize> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QSize>::begin((QArrayDataPointer<QSize> *)0x109485);
      pQVar4[-1] = (QSize)in_RDX->data;
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QSize *)((long)&(in_RDI->displaceTo->wd).m_i + 1);
      goto LAB_00109598;
    }
  }
  local_10 = (QSize)in_RDX->data;
  bVar5 = in_RDI->displaceTo != (QSize *)0x0;
  uVar6 = bVar5 && in_RSI == (QSize *)0x0;
  uVar2 = (uint)(bVar5 && in_RSI == (QSize *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QSize>::detachAndGrow
            ((QArrayDataPointer<QSize> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QSize **)CONCAT17(uVar1,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffffac,uVar2))),
             (QArrayDataPointer<QSize> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QSize> *)
                              CONCAT17(uVar1,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffffac,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::insertOne(in_RDI,(QSize *)CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::~Inserter(&local_38);
  }
  else {
    pQVar4 = QArrayDataPointer<QSize>::begin((QArrayDataPointer<QSize> *)0x10953b);
    pQVar4[-1] = local_10;
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QSize *)((long)&(in_RDI->displaceTo->wd).m_i + 1);
  }
LAB_00109598:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }